

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemSMC.cpp
# Opt level: O3

void __thiscall chrono::ChSystemSMC::ChSystemSMC(ChSystemSMC *this,bool use_material_properties)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  ChContactContainerSMC *pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ChContactForceSMC *pCVar6;
  undefined1 local_29;
  ChContactContainerSMC *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  ChSystem::ChSystem(&this->super_ChSystem);
  (this->super_ChSystem).super_ChIntegrableIIorder.super_ChIntegrable._vptr_ChIntegrable =
       (_func_int **)&PTR_GetNcoords_y_00b0d900;
  (this->super_ChSystem).field_0x379 = use_material_properties;
  *(undefined8 *)&(this->super_ChSystem).field_0x37c = 1;
  this->m_tdispl_model = OneStep;
  this->m_stiff_contact = false;
  pCVar6 = (ChContactForceSMC *)::operator_new(8);
  pCVar6->_vptr_ChContactForceSMC = (_func_int **)&PTR__ChContactForceSMC_00b0db60;
  (this->m_force_algo)._M_t.
  super___uniq_ptr_impl<chrono::ChSystemSMC::ChContactForceSMC,_std::default_delete<chrono::ChSystemSMC::ChContactForceSMC>_>
  ._M_t.
  super__Tuple_impl<0UL,_chrono::ChSystemSMC::ChContactForceSMC_*,_std::default_delete<chrono::ChSystemSMC::ChContactForceSMC>_>
  .super__Head_base<0UL,_chrono::ChSystemSMC::ChContactForceSMC_*,_false>._M_head_impl = pCVar6;
  local_28 = (ChContactContainerSMC *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSystemDescriptor,std::allocator<chrono::ChSystemDescriptor>>
            (&_Stack_20,(ChSystemDescriptor **)&local_28,
             (allocator<chrono::ChSystemDescriptor> *)&local_29);
  _Var5._M_pi = _Stack_20._M_pi;
  pCVar4 = local_28;
  local_28 = (ChContactContainerSMC *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->super_ChSystem).descriptor.
           super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->super_ChSystem).descriptor.
  super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar4;
  (this->super_ChSystem).descriptor.
  super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  ChSystem::SetSolverType(&this->super_ChSystem,PSOR);
  local_28 = (ChContactContainerSMC *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::collision::ChCollisionSystemBullet,std::allocator<chrono::collision::ChCollisionSystemBullet>>
            (&_Stack_20,(ChCollisionSystemBullet **)&local_28,
             (allocator<chrono::collision::ChCollisionSystemBullet> *)&local_29);
  _Var5._M_pi = _Stack_20._M_pi;
  pCVar4 = local_28;
  local_28 = (ChContactContainerSMC *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->super_ChSystem).collision_system.
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_ChSystem).collision_system.
  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar4;
  (this->super_ChSystem).collision_system.
  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  peVar2 = (this->super_ChSystem).collision_system.
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_ChCollisionSystem[0xd])
            (peVar2,(ulong)(uint)(this->super_ChSystem).nthreads_collision);
  ((this->super_ChSystem).collision_system.
   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_system = &this->super_ChSystem;
  (this->super_ChSystem).collision_system_type = BULLET;
  collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.0);
  local_28 = (ChContactContainerSMC *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChContactContainerSMC,std::allocator<chrono::ChContactContainerSMC>>
            (&_Stack_20,&local_28,(allocator<chrono::ChContactContainerSMC> *)&local_29);
  _Var5._M_pi = _Stack_20._M_pi;
  pCVar4 = local_28;
  local_28 = (ChContactContainerSMC *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->super_ChSystem).contact_container.
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->super_ChSystem).contact_container.
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pCVar4->super_ChContactContainer;
  (this->super_ChSystem).contact_container.
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  peVar3 = (this->super_ChSystem).contact_container.
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])(peVar3,this);
  this->m_minSlipVelocity = 0.0001;
  this->m_characteristicVelocity = 1.0;
  return;
}

Assistant:

ChSystemSMC::ChSystemSMC(bool use_material_properties)
    : ChSystem(),
      m_use_mat_props(use_material_properties),
      m_contact_model(Hertz),
      m_adhesion_model(AdhesionForceModel::Constant),
      m_tdispl_model(OneStep),
      m_stiff_contact(false),
      m_force_algo(new ChDefaultContactForceSMC) {
    descriptor = chrono_types::make_shared<ChSystemDescriptor>();

    SetSolverType(ChSolver::Type::PSOR);

    collision_system = chrono_types::make_shared<collision::ChCollisionSystemBullet>();
    collision_system->SetNumThreads(nthreads_collision);
    collision_system->SetSystem(this);
    collision_system_type = collision::ChCollisionSystemType::BULLET;

    // For default SMC there is no need to create contacts 'in advance'
    // when models are closer than the safety envelope, so set default envelope to 0
    collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0);

    contact_container = chrono_types::make_shared<ChContactContainerSMC>();
    contact_container->SetSystem(this);

    m_minSlipVelocity = 1e-4;
    m_characteristicVelocity = 1;
}